

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

void QHttpHeadersPrivate::removeAll(Self *d,HeaderName *name)

{
  bool bVar1;
  const_iterator abegin;
  const_iterator aend;
  const_iterator cVar2;
  QHttpHeadersPrivate *pQVar3;
  iterator iVar4;
  iterator this;
  HeaderName *in_RSI;
  long in_FS_OFFSET;
  qsizetype matchOffset;
  const_iterator it;
  qsizetype in_stack_ffffffffffffff58;
  QList<Header> *in_stack_ffffffffffffff60;
  QList<Header> *this_00;
  anon_class_8_1_898f2789_for__M_pred in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  const_iterator local_28;
  Header *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (Header *)0xaaaaaaaaaaaaaaaa;
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c52cf);
  QList<Header>::cbegin(in_stack_ffffffffffffff60);
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c52ea);
  abegin = QList<Header>::cend(in_stack_ffffffffffffff60);
  aend.i = (Header *)headerNameMatches(in_RSI);
  local_10 = std::find_if<QList<Header>::const_iterator,headerNameMatches(HeaderName_const&)::__0>
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90.i,
                        in_stack_ffffffffffffff88);
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c5330);
  cVar2 = QList<Header>::cend(in_stack_ffffffffffffff60);
  bVar1 = QList<Header>::const_iterator::operator!=(&local_10,cVar2);
  if (bVar1) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c5366);
    cVar2 = QList<Header>::cbegin(in_stack_ffffffffffffff60);
    QList<Header>::const_iterator::operator-(&local_10,cVar2);
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)in_stack_ffffffffffffff60);
    pQVar3 = QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c53a2);
    this_00 = &pQVar3->headers;
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c53b5);
    local_20 = (Header *)QList<Header>::begin(this_00);
    iVar4 = QList<Header>::iterator::operator+((iterator *)this_00,in_stack_ffffffffffffff58);
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c53ea);
    this = QList<Header>::end(this_00);
    headerNameMatches(in_RSI);
    iVar4 = std::remove_if<QList<Header>::iterator,headerNameMatches(HeaderName_const&)::__0>
                      (cVar2.i,in_stack_ffffffffffffff90,iVar4.i);
    QList<Header>::const_iterator::const_iterator(&local_18,iVar4);
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c543f);
    iVar4 = QList<Header>::end(this_00);
    QList<Header>::const_iterator::const_iterator(&local_28,iVar4);
    QList<Header>::erase((QList<Header> *)this.i,abegin,aend);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpHeadersPrivate::removeAll(Self &d, const HeaderName &name)
{
    const auto it = std::find_if(d->headers.cbegin(), d->headers.cend(), headerNameMatches(name));

    if (it != d->headers.cend()) {
        // Found something to remove, calculate offset so we can proceed from the match-location
        const auto matchOffset = it - d->headers.cbegin();
        d.detach();
        // Rearrange all matches to the end and erase them
        d->headers.erase(std::remove_if(d->headers.begin() + matchOffset, d->headers.end(),
                                        headerNameMatches(name)),
                         d->headers.end());
    }
}